

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

double uprv_trunc_63(double d)

{
  UBool UVar1;
  double d_local;
  
  UVar1 = uprv_isNaN_63(d);
  if (UVar1 == '\0') {
    UVar1 = uprv_isInfinite_63(d);
    if (UVar1 == '\0') {
      UVar1 = u_signBit(d);
      if (UVar1 == '\0') {
        d_local = floor(d);
      }
      else {
        d_local = ceil(d);
      }
    }
    else {
      d_local = uprv_getInfinity_63();
    }
  }
  else {
    d_local = uprv_getNaN_63();
  }
  return d_local;
}

Assistant:

U_CAPI double U_EXPORT2
uprv_trunc(double d)
{
#if IEEE_754
    /* handle error cases*/
    if(uprv_isNaN(d))
        return uprv_getNaN();
    if(uprv_isInfinite(d))
        return uprv_getInfinity();

    if(u_signBit(d))    /* Signbit() picks up -0.0;  d<0 does not. */
        return ceil(d);
    else
        return floor(d);

#else
    return d >= 0 ? floor(d) : ceil(d);

#endif
}